

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcBoxedHalfSpace::IfcBoxedHalfSpace(IfcBoxedHalfSpace *this)

{
  *(undefined ***)&this->field_0x70 = &PTR__Object_007631c0;
  *(undefined8 *)&this->field_0x78 = 0;
  *(char **)&this->field_0x80 = "IfcBoxedHalfSpace";
  IfcHalfSpaceSolid::IfcHalfSpaceSolid
            (&this->super_IfcHalfSpaceSolid,&PTR_construction_vtable_24__007dc180);
  *(undefined8 *)&(this->super_IfcHalfSpaceSolid).field_0x60 = 0;
  *(undefined8 *)&(this->super_IfcHalfSpaceSolid).field_0x68 = 0;
  (this->super_IfcHalfSpaceSolid).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x7dc0c8;
  *(undefined8 *)&this->field_0x70 = 0x7dc168;
  *(undefined8 *)
   &(this->super_IfcHalfSpaceSolid).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem
    .super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x7dc0f0;
  *(undefined8 *)
   &(this->super_IfcHalfSpaceSolid).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem
    .super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x7dc118;
  *(undefined8 *)&(this->super_IfcHalfSpaceSolid).field_0x58 = 0x7dc140;
  return;
}

Assistant:

IfcBoxedHalfSpace() : Object("IfcBoxedHalfSpace") {}